

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

void opj_setup_decoder(opj_dinfo_t *dinfo,opj_dparameters_t *parameters)

{
  if (parameters != (opj_dparameters_t *)0x0 && dinfo != (opj_dinfo_t *)0x0) {
    if ((uint)dinfo->codec_format < 2) {
      j2k_setup_decoder((opj_j2k_t *)dinfo->j2k_handle,parameters);
      return;
    }
    if (dinfo->codec_format == CODEC_JP2) {
      jp2_setup_decoder((opj_jp2_t *)dinfo->jp2_handle,parameters);
      return;
    }
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_setup_decoder(opj_dinfo_t *dinfo, opj_dparameters_t *parameters) {
	if(dinfo && parameters) {
		switch(dinfo->codec_format) {
			case CODEC_J2K:
			case CODEC_JPT:
				j2k_setup_decoder((opj_j2k_t*)dinfo->j2k_handle, parameters);
				break;
			case CODEC_JP2:
				jp2_setup_decoder((opj_jp2_t*)dinfo->jp2_handle, parameters);
				break;
			case CODEC_UNKNOWN:
			default:
				break;
		}
	}
}